

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkPrimal.cpp
# Opt level: O0

void __thiscall HEkkPrimal::phase1ChooseRow(HEkkPrimal *this)

{
  double dVar1;
  long lVar2;
  __normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
  begin;
  __normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
  begin_00;
  bool bVar3;
  int iVar4;
  reference pvVar5;
  reference pvVar6;
  const_reference pvVar7;
  reference pvVar8;
  size_type sVar9;
  size_type sVar10;
  undefined4 uVar11;
  vector<double,_std::allocator<double>_> *this_00;
  vector<double,_std::allocator<double>_> *this_01;
  vector<double,_std::allocator<double>_> *this_02;
  long *in_RDI;
  double dVar12;
  double dAbsAlpha_1;
  HighsInt iRow_3;
  HighsInt index_2;
  size_t i_3;
  double dAbsAlpha;
  HighsInt iRow_2;
  HighsInt index_1;
  double dMyTheta_1;
  size_t i_2;
  size_t iLast;
  double dMaxAlpha;
  HighsInt iRow_1;
  HighsInt index;
  double dMyTheta;
  size_t i_1;
  double dGradient;
  double dMaxTheta;
  double dTightTheta_1;
  double dRelaxTheta_1;
  double dFeasTheta_1;
  double dTightTheta;
  double dRelaxTheta;
  double dFeasTheta;
  double dAlpha;
  HighsInt iRow;
  HighsInt i;
  double dPivotTol;
  vector<double,_std::allocator<double>_> *baseValue;
  vector<double,_std::allocator<double>_> *baseUpper;
  vector<double,_std::allocator<double>_> *baseLower;
  HighsSimplexInfo *info;
  value_type *in_stack_fffffffffffffce8;
  undefined4 in_stack_fffffffffffffcf0;
  int iVar13;
  undefined4 in_stack_fffffffffffffcf4;
  __normal_iterator<std::pair<double,_int>_*,_std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>_>
  in_stack_fffffffffffffcf8;
  undefined4 in_stack_fffffffffffffd00;
  int in_stack_fffffffffffffd04;
  double local_238;
  double local_230;
  size_type local_210;
  size_type local_1f0;
  size_type local_1e8;
  double local_1e0;
  ulong local_1b8;
  double local_1b0;
  double local_1a8;
  int local_34;
  
  lVar2 = *in_RDI;
  this_00 = (vector<double,_std::allocator<double>_> *)(lVar2 + 0x2638);
  this_01 = (vector<double,_std::allocator<double>_> *)(lVar2 + 0x2650);
  this_02 = (vector<double,_std::allocator<double>_> *)(lVar2 + 0x2668);
  HighsSimplexAnalysis::simplexTimerStart
            ((HighsSimplexAnalysis *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
             (HighsInt)((ulong)in_stack_fffffffffffffcf8._M_current >> 0x20),
             (HighsInt)in_stack_fffffffffffffcf8._M_current);
  if (*(int *)(lVar2 + 0x2944) < 10) {
    local_230 = 1e-09;
  }
  else {
    local_238 = 1e-08;
    if (0x13 < *(int *)(lVar2 + 0x2944)) {
      local_238 = 1e-07;
    }
    local_230 = local_238;
  }
  std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::clear
            ((vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_> *)0x7aa229);
  std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::clear
            ((vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_> *)0x7aa23d);
  for (local_34 = 0; local_34 < *(int *)((long)in_RDI + 0x35c); local_34 = local_34 + 1) {
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x6c),(long)local_34);
    iVar4 = *pvVar5;
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x6f),(long)iVar4);
    dVar12 = *pvVar6 * (double)(int)in_RDI[9];
    if (local_230 < dVar12) {
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](this_02,(long)iVar4);
      dVar1 = *pvVar7;
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](this_01,(long)iVar4);
      if (*pvVar7 + (double)in_RDI[5] < dVar1) {
        std::vector<double,_std::allocator<double>_>::operator[](this_02,(long)iVar4);
        std::vector<double,_std::allocator<double>_>::operator[](this_01,(long)iVar4);
        std::make_pair<double&,int&>
                  ((double *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0),
                   (int *)in_stack_fffffffffffffce8);
        std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::push_back
                  ((vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_> *)
                   CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0),
                   in_stack_fffffffffffffce8);
        std::make_pair<double&,int&>
                  ((double *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0),
                   (int *)in_stack_fffffffffffffce8);
        std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::push_back
                  ((vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_> *)
                   CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0),
                   in_stack_fffffffffffffce8);
      }
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](this_02,(long)iVar4);
      dVar1 = *pvVar7;
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](this_00,(long)iVar4);
      if ((*pvVar7 - (double)in_RDI[5] < dVar1) &&
         (pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](this_00,(long)iVar4),
         -INFINITY < *pvVar7)) {
        std::vector<double,_std::allocator<double>_>::operator[](this_02,(long)iVar4);
        std::vector<double,_std::allocator<double>_>::operator[](this_00,(long)iVar4);
        std::vector<double,_std::allocator<double>_>::operator[](this_02,(long)iVar4);
        std::vector<double,_std::allocator<double>_>::operator[](this_00,(long)iVar4);
        std::make_pair<double&,int>
                  ((double *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0),
                   (int *)in_stack_fffffffffffffce8);
        std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::push_back
                  ((vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_> *)
                   CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0),
                   in_stack_fffffffffffffce8);
        std::make_pair<double&,int>
                  ((double *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0),
                   (int *)in_stack_fffffffffffffce8);
        std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::push_back
                  ((vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_> *)
                   CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0),
                   in_stack_fffffffffffffce8);
      }
    }
    if (dVar12 < -local_230) {
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](this_02,(long)iVar4);
      dVar12 = *pvVar7;
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](this_00,(long)iVar4);
      if (dVar12 < *pvVar7 - (double)in_RDI[5]) {
        std::vector<double,_std::allocator<double>_>::operator[](this_02,(long)iVar4);
        std::vector<double,_std::allocator<double>_>::operator[](this_00,(long)iVar4);
        std::make_pair<double&,int>
                  ((double *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0),
                   (int *)in_stack_fffffffffffffce8);
        std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::push_back
                  ((vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_> *)
                   CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0),
                   in_stack_fffffffffffffce8);
        std::make_pair<double&,int>
                  ((double *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0),
                   (int *)in_stack_fffffffffffffce8);
        std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::push_back
                  ((vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_> *)
                   CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0),
                   in_stack_fffffffffffffce8);
      }
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](this_02,(long)iVar4);
      dVar12 = *pvVar7;
      pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](this_01,(long)iVar4);
      if ((dVar12 < *pvVar7 + (double)in_RDI[5]) &&
         (pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](this_01,(long)iVar4),
         *pvVar7 <= INFINITY && *pvVar7 != INFINITY)) {
        std::vector<double,_std::allocator<double>_>::operator[](this_02,(long)iVar4);
        std::vector<double,_std::allocator<double>_>::operator[](this_01,(long)iVar4);
        std::vector<double,_std::allocator<double>_>::operator[](this_02,(long)iVar4);
        std::vector<double,_std::allocator<double>_>::operator[](this_01,(long)iVar4);
        std::make_pair<double&,int&>
                  ((double *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0),
                   (int *)in_stack_fffffffffffffce8);
        std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::push_back
                  ((vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_> *)
                   CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0),
                   in_stack_fffffffffffffce8);
        std::make_pair<double&,int&>
                  ((double *)CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0),
                   (int *)in_stack_fffffffffffffce8);
        std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::push_back
                  ((vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_> *)
                   CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0),
                   in_stack_fffffffffffffce8);
      }
    }
  }
  HighsSimplexAnalysis::simplexTimerStop
            ((HighsSimplexAnalysis *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
             (HighsInt)((ulong)in_stack_fffffffffffffcf8._M_current >> 0x20),
             (HighsInt)in_stack_fffffffffffffcf8._M_current);
  bVar3 = std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::empty
                    ((vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_> *)
                     CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00));
  if (bVar3) {
    *(undefined4 *)((long)in_RDI + 0x4c) = 0xffffffff;
    *(undefined4 *)(in_RDI + 10) = 0xffffffff;
  }
  else {
    HighsSimplexAnalysis::simplexTimerStart
              ((HighsSimplexAnalysis *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00)
               ,(HighsInt)((ulong)in_stack_fffffffffffffcf8._M_current >> 0x20),
               (HighsInt)in_stack_fffffffffffffcf8._M_current);
    std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::begin
              ((vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_> *)
               in_stack_fffffffffffffce8);
    std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::end
              ((vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_> *)
               in_stack_fffffffffffffce8);
    begin._M_current._4_4_ = in_stack_fffffffffffffd04;
    begin._M_current._0_4_ = in_stack_fffffffffffffd00;
    pdqsort<__gnu_cxx::__normal_iterator<std::pair<double,int>*,std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>>>
              (begin,in_stack_fffffffffffffcf8);
    pvVar8 = std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::
             operator[]((vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_> *)
                        (in_RDI + 0x12),0);
    local_1b0 = ABS((double)in_RDI[0xb]);
    local_1a8 = pvVar8->first;
    for (local_1b8 = 0;
        sVar9 = std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::size
                          ((vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                            *)(in_RDI + 0x12)), local_1b8 < sVar9; local_1b8 = local_1b8 + 1) {
      pvVar8 = std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::
               operator[]((vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                           *)(in_RDI + 0x12),local_1b8);
      dVar12 = pvVar8->first;
      pvVar8 = std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::
               operator[]((vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                           *)(in_RDI + 0x12),local_1b8);
      in_stack_fffffffffffffd04 = pvVar8->second;
      if (in_stack_fffffffffffffd04 < 0) {
        in_stack_fffffffffffffd04 = in_stack_fffffffffffffd04 + *(int *)((long)in_RDI + 0x14);
      }
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x6f),
                          (long)in_stack_fffffffffffffd04);
      local_1b0 = local_1b0 - ABS(*pvVar6);
      if (local_1b0 <= 0.0) break;
      local_1a8 = dVar12;
    }
    std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::begin
              ((vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_> *)
               in_stack_fffffffffffffce8);
    std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::end
              ((vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_> *)
               in_stack_fffffffffffffce8);
    begin_00._M_current._4_4_ = in_stack_fffffffffffffd04;
    begin_00._M_current._0_4_ = in_stack_fffffffffffffd00;
    pdqsort<__gnu_cxx::__normal_iterator<std::pair<double,int>*,std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>>>
              (begin_00,in_stack_fffffffffffffcf8);
    local_1e0 = 0.0;
    local_1e8 = std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::size
                          ((vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                            *)(in_RDI + 0x15));
    local_1f0 = 0;
    while (sVar9 = local_1f0,
          sVar10 = std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::
                   size((vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_> *)
                        (in_RDI + 0x15)), sVar9 < sVar10) {
      pvVar8 = std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::
               operator[]((vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                           *)(in_RDI + 0x15),local_1f0);
      dVar12 = pvVar8->first;
      pvVar8 = std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::
               operator[]((vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                           *)(in_RDI + 0x15),local_1f0);
      iVar4 = pvVar8->second;
      if (iVar4 < 0) {
        iVar4 = iVar4 + *(int *)((long)in_RDI + 0x14);
      }
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x6f),(long)iVar4);
      if (local_1a8 < dVar12) {
        local_1e8 = local_1f0;
        break;
      }
      if (local_1e0 < ABS(*pvVar6)) {
        local_1e0 = ABS(*pvVar6);
      }
      local_1f0 = local_1f0 + 1;
    }
    *(undefined4 *)((long)in_RDI + 0x4c) = 0xffffffff;
    *(undefined4 *)(in_RDI + 10) = 0xffffffff;
    *(undefined4 *)((long)in_RDI + 0x54) = 0;
    for (local_210 = local_1e8; local_210 != 0; local_210 = local_210 - 1) {
      pvVar8 = std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::
               operator[]((vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                           *)(in_RDI + 0x15),local_210 - 1);
      iVar4 = pvVar8->second;
      iVar13 = iVar4;
      if (iVar4 < 0) {
        iVar13 = iVar4 + *(int *)((long)in_RDI + 0x14);
      }
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x6f),(long)iVar13);
      if (local_1e0 * 0.1 < ABS(*pvVar6)) {
        *(int *)((long)in_RDI + 0x4c) = iVar13;
        uVar11 = 0xffffffff;
        if (-1 < iVar4) {
          uVar11 = 1;
        }
        *(undefined4 *)((long)in_RDI + 0x54) = uVar11;
        break;
      }
    }
    HighsSimplexAnalysis::simplexTimerStop
              ((HighsSimplexAnalysis *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00)
               ,(HighsInt)(sVar9 >> 0x20),(HighsInt)sVar9);
  }
  return;
}

Assistant:

void HEkkPrimal::phase1ChooseRow() {
  const HighsSimplexInfo& info = ekk_instance_.info_;
  const vector<double>& baseLower = info.baseLower_;
  const vector<double>& baseUpper = info.baseUpper_;
  const vector<double>& baseValue = info.baseValue_;
  analysis->simplexTimerStart(Chuzr1Clock);
  // Collect phase 1 theta lists
  //

  const double dPivotTol = info.update_count < 10   ? 1e-9
                           : info.update_count < 20 ? 1e-8
                                                    : 1e-7;
  ph1SorterR.clear();
  ph1SorterT.clear();
  for (HighsInt i = 0; i < col_aq.count; i++) {
    HighsInt iRow = col_aq.index[i];
    double dAlpha = col_aq.array[iRow] * move_in;

    // When the basic variable x[i] decrease
    if (dAlpha > +dPivotTol) {
      // Whether it can become feasible by going below its upper bound
      if (baseValue[iRow] > baseUpper[iRow] + primal_feasibility_tolerance) {
        double dFeasTheta =
            (baseValue[iRow] - baseUpper[iRow] - primal_feasibility_tolerance) /
            dAlpha;
        ph1SorterR.push_back(std::make_pair(dFeasTheta, iRow));
        ph1SorterT.push_back(std::make_pair(dFeasTheta, iRow));
      }
      // Whether it can become infeasible (again) by going below its
      // lower bound
      if (baseValue[iRow] > baseLower[iRow] - primal_feasibility_tolerance &&
          baseLower[iRow] > -kHighsInf) {
        double dRelaxTheta =
            (baseValue[iRow] - baseLower[iRow] + primal_feasibility_tolerance) /
            dAlpha;
        double dTightTheta = (baseValue[iRow] - baseLower[iRow]) / dAlpha;
        ph1SorterR.push_back(std::make_pair(dRelaxTheta, iRow - num_row));
        ph1SorterT.push_back(std::make_pair(dTightTheta, iRow - num_row));
      }
    }

    // When the basic variable x[i] increase
    if (dAlpha < -dPivotTol) {
      // Whether it can become feasible by going above its lower bound
      if (baseValue[iRow] < baseLower[iRow] - primal_feasibility_tolerance) {
        double dFeasTheta =
            (baseValue[iRow] - baseLower[iRow] + primal_feasibility_tolerance) /
            dAlpha;
        ph1SorterR.push_back(std::make_pair(dFeasTheta, iRow - num_row));
        ph1SorterT.push_back(std::make_pair(dFeasTheta, iRow - num_row));
      }
      // Whether it can become infeasible (again) by going above its
      // upper bound
      if (baseValue[iRow] < baseUpper[iRow] + primal_feasibility_tolerance &&
          baseUpper[iRow] < +kHighsInf) {
        double dRelaxTheta =
            (baseValue[iRow] - baseUpper[iRow] - primal_feasibility_tolerance) /
            dAlpha;
        double dTightTheta = (baseValue[iRow] - baseUpper[iRow]) / dAlpha;
        ph1SorterR.push_back(std::make_pair(dRelaxTheta, iRow));
        ph1SorterT.push_back(std::make_pair(dTightTheta, iRow));
      }
    }
  }

  analysis->simplexTimerStop(Chuzr1Clock);
  // When there are no candidates at all, we can leave it here
  if (ph1SorterR.empty()) {
    row_out = kNoRowChosen;
    variable_out = -1;
    return;
  }

  // Now sort the relaxed theta to find the final break point. TODO:
  // Consider partial sort. Or heapify [O(n)] and then pop k points
  // [kO(log(n))].

  analysis->simplexTimerStart(Chuzr2Clock);
  pdqsort(ph1SorterR.begin(), ph1SorterR.end());
  double dMaxTheta = ph1SorterR[0].first;
  double dGradient = fabs(theta_dual);
  for (size_t i = 0; i < ph1SorterR.size(); i++) {
    double dMyTheta = ph1SorterR[i].first;
    HighsInt index = ph1SorterR[i].second;
    HighsInt iRow = index >= 0 ? index : index + num_row;
    dGradient -= fabs(col_aq.array[iRow]);
    // Stop when the gradient start to decrease
    if (dGradient <= 0) {
      break;
    }
    dMaxTheta = dMyTheta;
  }

  // Find out the biggest possible alpha for pivot
  pdqsort(ph1SorterT.begin(), ph1SorterT.end());
  double dMaxAlpha = 0.0;
  size_t iLast = ph1SorterT.size();
  for (size_t i = 0; i < ph1SorterT.size(); i++) {
    double dMyTheta = ph1SorterT[i].first;
    HighsInt index = ph1SorterT[i].second;
    HighsInt iRow = index >= 0 ? index : index + num_row;
    double dAbsAlpha = fabs(col_aq.array[iRow]);
    // Stop when the theta is too large
    if (dMyTheta > dMaxTheta) {
      iLast = i;
      break;
    }
    // Update the maximal possible alpha
    if (dMaxAlpha < dAbsAlpha) {
      dMaxAlpha = dAbsAlpha;
    }
  }

  // Finally choose a pivot with good enough alpha, working backwards
  row_out = kNoRowChosen;
  variable_out = -1;
  move_out = 0;
  for (size_t i = iLast; i > 0; i--) {
    HighsInt index = ph1SorterT[i - 1].second;
    HighsInt iRow = index >= 0 ? index : index + num_row;
    double dAbsAlpha = fabs(col_aq.array[iRow]);
    if (dAbsAlpha > dMaxAlpha * 0.1) {
      row_out = iRow;
      move_out = index >= 0 ? 1 : -1;
      break;
    }
  }
  analysis->simplexTimerStop(Chuzr2Clock);
}